

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O2

int decode_hex4(char *hex)

{
  long lVar1;
  int iVar2;
  byte bVar3;
  int digit [4];
  
  lVar1 = 0;
  do {
    if (lVar1 == 4) {
      return digit[2] * 0x10 + digit[1] * 0x100 + digit[0] * 0x1000 + digit[3];
    }
    bVar3 = hex[lVar1];
    if ((byte)(bVar3 - 0x30) < 10) {
      iVar2 = -0x30;
    }
    else {
      bVar3 = bVar3 | 0x20;
      iVar2 = -0x57;
      if (5 < (byte)(bVar3 + 0x9f)) {
        return -1;
      }
    }
    digit[lVar1] = (uint)bVar3 + iVar2;
    lVar1 = lVar1 + 1;
  } while( true );
}

Assistant:

static int decode_hex4(const char *hex)
{
    int digit[4];
    int i;

    /* Convert ASCII hex digit to numeric digit
     * Note: this returns an error for invalid hex digits, including
     *       NULL */
    for (i = 0; i < 4; i++) {
        digit[i] = hexdigit2int(hex[i]);
        if (digit[i] < 0) {
            return -1;
        }
    }

    return (digit[0] << 12) +
           (digit[1] << 8) +
           (digit[2] << 4) +
            digit[3];
}